

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

int __thiscall rw::StreamFile::open(StreamFile *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(__file,___oflag);
  this->file = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    open(__file,(int)___oflag);
    this = (StreamFile *)0x0;
  }
  return (int)this;
}

Assistant:

StreamFile*
StreamFile::open(const char *path, const char *mode)
{
	assert(this->file == nil);
	this->file = fopen(path, mode);
	if(this->file == nil){
		RWERROR((ERR_FILE, path));
		return nil;
	}
	return this;
}